

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiWindowSettings * ImGui::CreateNewWindowSettings(char *name)

{
  uint uVar1;
  int *piVar2;
  undefined8 *puVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  ImU32 IVar6;
  ImGuiWindowSettings *pIVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  ImGuiWindowSettings *pIVar11;
  ImGuiContext *ctx;
  
  pIVar4 = GImGui;
  iVar5 = (GImGui->SettingsWindows).Size;
  if (iVar5 == (GImGui->SettingsWindows).Capacity) {
    if (iVar5 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar5 / 2 + iVar5;
    }
    iVar10 = iVar5 + 1;
    if (iVar5 + 1 < iVar9) {
      iVar10 = iVar9;
    }
    piVar2 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar2 = *piVar2 + 1;
    pIVar7 = (ImGuiWindowSettings *)(*GImAllocatorAllocFunc)((long)iVar10 << 5,GImAllocatorUserData)
    ;
    pIVar11 = (pIVar4->SettingsWindows).Data;
    if (pIVar11 != (ImGuiWindowSettings *)0x0) {
      memcpy(pIVar7,pIVar11,(long)(pIVar4->SettingsWindows).Size << 5);
      pIVar11 = (pIVar4->SettingsWindows).Data;
      if ((pIVar11 != (ImGuiWindowSettings *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar11,GImAllocatorUserData);
    }
    (pIVar4->SettingsWindows).Data = pIVar7;
    (pIVar4->SettingsWindows).Capacity = iVar10;
    iVar5 = (pIVar4->SettingsWindows).Size;
  }
  else {
    pIVar7 = (GImGui->SettingsWindows).Data;
  }
  puVar3 = (undefined8 *)((long)&pIVar7[iVar5].Pos.x + 1);
  *puVar3 = 0;
  puVar3[1] = 0;
  pIVar7 = pIVar7 + iVar5;
  pIVar7->Name = (char *)0x0;
  pIVar7->ID = 0;
  (pIVar7->Pos).x = 0.0;
  iVar5 = (pIVar4->SettingsWindows).Size;
  uVar1 = iVar5 + 1;
  (pIVar4->SettingsWindows).Size = uVar1;
  if (-1 < iVar5) {
    pIVar7 = (pIVar4->SettingsWindows).Data;
    pIVar11 = pIVar7 + ((ulong)uVar1 - 1);
    pcVar8 = strstr(name,"###");
    if (pcVar8 != (char *)0x0) {
      name = pcVar8;
    }
    pcVar8 = ImStrdup(name);
    pIVar11->Name = pcVar8;
    IVar6 = ImHashStr(name,0,0);
    pIVar7[(ulong)uVar1 - 1].ID = IVar6;
    return pIVar11;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                ,0x4e2,"T &ImVector<ImGuiWindowSettings>::back() [T = ImGuiWindowSettings]");
}

Assistant:

ImGuiWindowSettings* ImGui::CreateNewWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;
    g.SettingsWindows.push_back(ImGuiWindowSettings());
    ImGuiWindowSettings* settings = &g.SettingsWindows.back();
#if !IMGUI_DEBUG_INI_SETTINGS
    // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
    // Preserve the full string when IMGUI_DEBUG_INI_SETTINGS is set to make .ini inspection easier.
    if (const char* p = strstr(name, "###"))
        name = p;
#endif
    settings->Name = ImStrdup(name);
    settings->ID = ImHashStr(name);
    return settings;
}